

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setSharedCacheTableLock(Btree *p,Pgno iTable,u8 eLock)

{
  BtShared *pBVar1;
  BtLock *local_38;
  BtLock *pIter;
  BtLock *pLock;
  BtShared *pBt;
  u8 eLock_local;
  Pgno iTable_local;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  pIter = (BtLock *)0x0;
  local_38 = pBVar1->pLock;
  do {
    if (local_38 == (BtLock *)0x0) {
LAB_0019180e:
      if (pIter == (BtLock *)0x0) {
        pIter = (BtLock *)sqlite3MallocZero(0x18);
        if (pIter == (BtLock *)0x0) {
          return 7;
        }
        pIter->iTable = iTable;
        pIter->pBtree = p;
        pIter->pNext = pBVar1->pLock;
        pBVar1->pLock = pIter;
      }
      if (pIter->eLock < eLock) {
        pIter->eLock = eLock;
      }
      return 0;
    }
    if ((local_38->iTable == iTable) && (local_38->pBtree == p)) {
      pIter = local_38;
      goto LAB_0019180e;
    }
    local_38 = local_38->pNext;
  } while( true );
}

Assistant:

static int setSharedCacheTableLock(Btree *p, Pgno iTable, u8 eLock){
  BtShared *pBt = p->pBt;
  BtLock *pLock = 0;
  BtLock *pIter;

  assert( sqlite3BtreeHoldsMutex(p) );
  assert( eLock==READ_LOCK || eLock==WRITE_LOCK );
  assert( p->db!=0 );

  /* A connection with the read-uncommitted flag set will never try to
  ** obtain a read-lock using this function. The only read-lock obtained
  ** by a connection in read-uncommitted mode is on the sqlite_master 
  ** table, and that lock is obtained in BtreeBeginTrans().  */
  assert( 0==(p->db->flags&SQLITE_ReadUncommit) || eLock==WRITE_LOCK );

  /* This function should only be called on a sharable b-tree after it 
  ** has been determined that no other b-tree holds a conflicting lock.  */
  assert( p->sharable );
  assert( SQLITE_OK==querySharedCacheTableLock(p, iTable, eLock) );

  /* First search the list for an existing lock on this table. */
  for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
    if( pIter->iTable==iTable && pIter->pBtree==p ){
      pLock = pIter;
      break;
    }
  }

  /* If the above search did not find a BtLock struct associating Btree p
  ** with table iTable, allocate one and link it into the list.
  */
  if( !pLock ){
    pLock = (BtLock *)sqlite3MallocZero(sizeof(BtLock));
    if( !pLock ){
      return SQLITE_NOMEM_BKPT;
    }
    pLock->iTable = iTable;
    pLock->pBtree = p;
    pLock->pNext = pBt->pLock;
    pBt->pLock = pLock;
  }

  /* Set the BtLock.eLock variable to the maximum of the current lock
  ** and the requested lock. This means if a write-lock was already held
  ** and a read-lock requested, we don't incorrectly downgrade the lock.
  */
  assert( WRITE_LOCK>READ_LOCK );
  if( eLock>pLock->eLock ){
    pLock->eLock = eLock;
  }

  return SQLITE_OK;
}